

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ffrecord.c
# Opt level: O0

void recff_buffer_method_put(jit_State *J,RecordFFData *rd)

{
  uint uVar1;
  IRRef1 IVar2;
  TRef ud_00;
  TRef TVar3;
  TRef TVar4;
  TRef len;
  TRef trw;
  TRef trr;
  TRef ud2;
  ptrdiff_t arg;
  uint local_e8;
  TRef tr;
  TRef trbuf;
  TRef ud;
  RecordFFData *rd_local;
  jit_State *J_local;
  TRef len_1;
  
  ud_00 = recff_sbufx_check(J,rd,0);
  local_e8 = recff_sbufx_write(J,ud_00);
  if (J->base[1] != 0) {
    _trr = 1;
    while( true ) {
      uVar1 = J->base[_trr];
      IVar2 = (IRRef1)local_e8;
      if (uVar1 == 0) break;
      if ((uVar1 & 0x1f000000) == 0x4000000) {
        (J->fold).ins.field_0.ot = 0x5689;
        (J->fold).ins.field_0.op1 = IVar2;
        (J->fold).ins.field_0.op2 = (IRRef1)uVar1;
        local_e8 = lj_opt_fold(J);
      }
      else if ((uVar1 >> 0x18 & 0x1f) - 0xe < 6) {
        (J->fold).ins.field_0.ot = 0x5d04;
        (J->fold).ins.field_0.op1 = (IRRef1)uVar1;
        *(ushort *)((long)&(J->fold).ins + 2) = (ushort)((uVar1 & 0x1f000000) == 0xe000000);
        TVar3 = lj_opt_fold(J);
        (J->fold).ins.field_0.ot = 0x5689;
        (J->fold).ins.field_0.op1 = IVar2;
        (J->fold).ins.field_0.op2 = (IRRef1)TVar3;
        local_e8 = lj_opt_fold(J);
      }
      else if ((uVar1 & 0x1f000000) == 0xc000000) {
        TVar3 = recff_sbufx_check(J,rd,(int)_trr);
        IVar2 = (IRRef1)TVar3;
        (J->fold).ins.field_0.ot = 0x4509;
        (J->fold).ins.field_0.op1 = IVar2;
        (J->fold).ins.field_0.op2 = 0x15;
        TVar3 = lj_opt_fold(J);
        (J->fold).ins.field_0.ot = 0x4509;
        (J->fold).ins.field_0.op1 = IVar2;
        (J->fold).ins.field_0.op2 = 0x10;
        TVar4 = lj_opt_fold(J);
        (J->fold).ins.field_0.ot = 0x2a15;
        (J->fold).ins.field_0.op1 = (IRRef1)TVar4;
        (J->fold).ins.field_0.op2 = (IRRef1)TVar3;
        TVar4 = lj_opt_fold(J);
        (J->fold).ins.field_0.ot = 0x5b13;
        (J->fold).ins.field_0.op1 = (IRRef1)TVar4;
        (J->fold).ins.field_0.op2 = 0x1275;
        TVar4 = lj_opt_fold(J);
        (J->fold).ins.field_0.ot = 0x989;
        (J->fold).ins.field_0.op1 = (IRRef1)ud_00;
        (J->fold).ins.field_0.op2 = IVar2;
        lj_opt_fold(J);
        local_e8 = lj_ir_call(J,IRCALL_lj_buf_putmem,(ulong)local_e8,(ulong)TVar3,(ulong)TVar4);
      }
      else {
        recff_nyi(J,rd);
      }
      _trr = _trr + 1;
    }
    (J->fold).ins.field_0.ot = 0x1200;
    (J->fold).ins.field_0.op1 = IVar2;
    (J->fold).ins.field_0.op2 = 0;
    lj_opt_fold(J);
  }
  return;
}

Assistant:

static void LJ_FASTCALL recff_buffer_method_put(jit_State *J, RecordFFData *rd)
{
  TRef ud = recff_sbufx_check(J, rd, 0);
  TRef trbuf = recff_sbufx_write(J, ud);
  TRef tr;
  ptrdiff_t arg;
  if (!J->base[1]) return;
  for (arg = 1; (tr = J->base[arg]); arg++) {
    if (tref_isstr(tr)) {
      trbuf = emitir(IRTG(IR_BUFPUT, IRT_PGC), trbuf, tr);
    } else if (tref_isnumber(tr)) {
      trbuf = emitir(IRTG(IR_BUFPUT, IRT_PGC), trbuf,
		     emitir(IRT(IR_TOSTR, IRT_STR), tr,
			    tref_isnum(tr) ? IRTOSTR_NUM : IRTOSTR_INT));
    } else if (tref_isudata(tr)) {
      TRef ud2 = recff_sbufx_check(J, rd, arg);
      TRef trr = recff_sbufx_get_ptr(J, ud2, IRFL_SBUF_R);
      TRef trw = recff_sbufx_get_ptr(J, ud2, IRFL_SBUF_W);
      TRef len = recff_sbufx_len(J, trr, trw);
      emitir(IRTG(IR_NE, IRT_PGC), ud, ud2);
      trbuf = lj_ir_call(J, IRCALL_lj_buf_putmem, trbuf, trr, len);
    } else {
      recff_nyiu(J, rd);
    }
  }
  emitir(IRT(IR_USE, IRT_NIL), trbuf, 0);
}